

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_moves_32_al(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3fc) == 0) {
    m68ki_exception_illegal();
    return;
  }
  if (m68ki_cpu.s_flag != 0) {
    my_fc_handler(m68ki_cpu.s_flag | 2);
    uVar3 = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar3 = pmmu_translate_addr(uVar3);
    }
    uVar1 = m68k_read_memory_16(uVar3 & m68ki_cpu.address_mask);
    my_fc_handler(m68ki_cpu.s_flag | 2);
    uVar3 = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 4;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar3 = pmmu_translate_addr(uVar3);
    }
    uVar2 = m68k_read_memory_32(uVar3 & m68ki_cpu.address_mask);
    if ((uVar1 >> 0xb & 1) == 0) {
      my_fc_handler(m68ki_cpu.sfc);
      if (m68ki_cpu.pmmu_enabled != 0) {
        uVar2 = pmmu_translate_addr(uVar2);
      }
      uVar2 = m68k_read_memory_32(uVar2 & m68ki_cpu.address_mask);
      *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar1 >> 10 & 0x3c)) = uVar2;
    }
    else {
      uVar1 = *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar1 >> 10 & 0x3c));
      my_fc_handler(m68ki_cpu.dfc);
      if (m68ki_cpu.pmmu_enabled != 0) {
        uVar2 = pmmu_translate_addr(uVar2);
      }
      m68k_write_memory_32(uVar2 & m68ki_cpu.address_mask,uVar1);
    }
    if (((ushort)m68ki_cpu.cpu_type & 0x18) != 0) {
      m68ki_remaining_cycles = m68ki_remaining_cycles + -2;
    }
    return;
  }
  m68ki_exception_privilege_violation();
  return;
}

Assistant:

static void m68k_op_moves_32_al(void)
{
	if(CPU_TYPE_IS_010_PLUS(CPU_TYPE))
	{
		if(FLAG_S)
		{
			uint word2 = OPER_I_16();
			uint ea = EA_AL_32();

			m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
			if(BIT_B(word2))		   /* Register to memory */
			{
				m68ki_write_32_fc(ea, REG_DFC, REG_DA[(word2 >> 12) & 15]);
				if(CPU_TYPE_IS_020_VARIANT(CPU_TYPE))
					USE_CYCLES(2);
				return;
			}
			/* Memory to register */
			REG_DA[(word2 >> 12) & 15] = m68ki_read_32_fc(ea, REG_SFC);
			if(CPU_TYPE_IS_020_VARIANT(CPU_TYPE))
				USE_CYCLES(2);
			return;
		}
		m68ki_exception_privilege_violation();
		return;
	}
	m68ki_exception_illegal();
}